

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile(DescriptorTable *table)

{
  ctrl_t *pcVar1;
  byte *pbVar2;
  ushort uVar3;
  ushort x;
  undefined1 auVar4 [16];
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  GeneratedMessageFactory *pGVar8;
  CommonFields *common;
  ctrl_t *pcVar9;
  DescriptorTable *key;
  EqualElement<const_google::protobuf::internal::DescriptorTable_*> *pEVar10;
  size_t sVar11;
  once_flag *poVar12;
  slot_type *ppDVar13;
  LogMessage *this;
  DescriptorTable **ts;
  DescriptorTable **ts_00;
  DescriptorTable **ts_01;
  DescriptorTable **ts_02;
  ulong extraout_RDX;
  flat_hash_set<const_google::protobuf::internal::DescriptorTable_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  *common_00;
  DescriptorTable *pDVar14;
  PolicyFunctions *in_R9;
  ushort uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i match;
  ctrl_t cVar20;
  byte bVar21;
  ctrl_t cVar24;
  ctrl_t cVar26;
  ctrl_t cVar28;
  ctrl_t cVar30;
  ctrl_t cVar32;
  ctrl_t cVar34;
  ctrl_t cVar36;
  ctrl_t cVar38;
  ctrl_t cVar40;
  ctrl_t cVar42;
  ctrl_t cVar44;
  ctrl_t cVar46;
  ctrl_t cVar48;
  ctrl_t cVar50;
  ctrl_t cVar52;
  undefined1 auVar22 [16];
  byte bVar25;
  byte bVar27;
  byte bVar29;
  byte bVar31;
  byte bVar33;
  byte bVar35;
  byte bVar37;
  byte bVar39;
  byte bVar41;
  byte bVar43;
  byte bVar45;
  byte bVar47;
  byte bVar49;
  byte bVar51;
  byte bVar53;
  undefined1 auVar23 [16];
  iterator iVar54;
  FindInfo target;
  probe_seq<16UL> seq;
  DescriptorTable *local_90;
  iterator local_88;
  undefined8 local_78;
  ctrl_t cStack_70;
  ctrl_t cStack_6f;
  ctrl_t cStack_6e;
  ctrl_t cStack_6d;
  ctrl_t cStack_6c;
  ctrl_t cStack_6b;
  ctrl_t cStack_6a;
  ctrl_t cStack_69;
  undefined1 local_68 [16];
  byte local_58;
  byte bStack_57;
  byte bStack_56;
  byte bStack_55;
  byte bStack_54;
  byte bStack_53;
  byte bStack_52;
  byte bStack_51;
  byte bStack_50;
  byte bStack_4f;
  byte bStack_4e;
  byte bStack_4d;
  byte bStack_4c;
  byte bStack_4b;
  byte bStack_4a;
  byte bStack_49;
  iterator local_40;
  
  pGVar8 = anon_unknown_19::GeneratedMessageFactory::singleton();
  common_00 = &pGVar8->files_;
  pDVar14 = (DescriptorTable *)&local_90;
  local_90 = table;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
  ::AssertOnFind<google::protobuf::internal::DescriptorTable_const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
              *)common_00,&local_90);
  bVar5 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          ::is_soo(&common_00->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                  );
  if (bVar5) {
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            ::empty(&common_00->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   );
    if (bVar5) {
      bVar5 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              ::is_soo(&common_00->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                      );
      if (!bVar5) {
        __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe3f,
                      "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                     );
      }
      absl::lts_20250127::container_internal::CommonFields::set_full_soo((CommonFields *)common_00);
      iVar54 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ::soo_iterator(&common_00->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                             );
    }
    else {
      seq.offset_ = (size_t)common_00;
      seq.mask_ = (size_t)&local_90;
      pEVar10 = (EqualElement<const_google::protobuf::internal::DescriptorTable_*> *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                ::soo_slot(&common_00->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                          );
      bVar5 = absl::lts_20250127::container_internal::
              hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>::EqualElement<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::internal::DescriptorTable_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>>
                        ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
                          *)&seq,pEVar10,ts_00);
      if (bVar5) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
        ::soo_iterator(&common_00->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                      );
        goto LAB_0029937b;
      }
      pDVar14 = (DescriptorTable *)0x3;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
      ::resize_impl(common_00);
      sVar11 = anon_unknown_19::GeneratedMessageFactory::DescriptorByNameHash::operator()
                         ((DescriptorByNameHash *)local_90,pDVar14);
      sVar11 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                         (sVar11,8,(CommonFields *)common_00);
      iVar54 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ::iterator_at(&common_00->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                             ,sVar11);
    }
  }
  else {
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            ::is_soo(&common_00->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                    );
    if (bVar5) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf66,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = const google::protobuf::internal::DescriptorTable *]"
                   );
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
    ::prefetch_heap_block
              (&common_00->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              );
    common = (CommonFields *)
             anon_unknown_19::GeneratedMessageFactory::DescriptorByNameHash::operator()
                       ((DescriptorByNameHash *)local_90,pDVar14);
    absl::lts_20250127::container_internal::probe(&seq,(CommonFields *)common_00,(size_t)common);
    pcVar9 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             ::control(&common_00->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                      );
    auVar18 = ZEXT216(CONCAT11((char)common,(char)common) & 0x7f7f);
    auVar18 = pshuflw(auVar18,auVar18,0);
    uVar17 = auVar18._0_4_;
    local_68._4_4_ = uVar17;
    local_68._0_4_ = uVar17;
    local_68._8_4_ = uVar17;
    local_68._12_4_ = uVar17;
    while( true ) {
      pcVar1 = pcVar9 + seq.offset_;
      auVar18[0] = -(local_68[0] == *pcVar1);
      auVar18[1] = -(local_68[1] == pcVar1[1]);
      auVar18[2] = -(local_68[2] == pcVar1[2]);
      auVar18[3] = -(local_68[3] == pcVar1[3]);
      auVar18[4] = -(local_68[4] == pcVar1[4]);
      auVar18[5] = -(local_68[5] == pcVar1[5]);
      auVar18[6] = -(local_68[6] == pcVar1[6]);
      auVar18[7] = -(local_68[7] == pcVar1[7]);
      auVar18[8] = -(local_68[8] == pcVar1[8]);
      auVar18[9] = -(local_68[9] == pcVar1[9]);
      auVar18[10] = -(local_68[10] == pcVar1[10]);
      auVar18[0xb] = -(local_68[0xb] == pcVar1[0xb]);
      auVar18[0xc] = -(local_68[0xc] == pcVar1[0xc]);
      auVar18[0xd] = -(local_68[0xd] == pcVar1[0xd]);
      auVar18[0xe] = -(local_68[0xe] == pcVar1[0xe]);
      auVar18[0xf] = -(local_68[0xf] == pcVar1[0xf]);
      cVar20 = *pcVar1;
      cVar24 = pcVar1[1];
      cVar26 = pcVar1[2];
      cVar28 = pcVar1[3];
      cVar30 = pcVar1[4];
      cVar32 = pcVar1[5];
      cVar34 = pcVar1[6];
      cVar36 = pcVar1[7];
      cVar38 = pcVar1[8];
      cVar40 = pcVar1[9];
      cVar42 = pcVar1[10];
      cVar44 = pcVar1[0xb];
      cVar46 = pcVar1[0xc];
      cVar48 = pcVar1[0xd];
      cVar50 = pcVar1[0xe];
      cVar52 = pcVar1[0xf];
      for (uVar15 = (ushort)(SUB161(auVar18 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar18[0xf] >> 7) << 0xf; uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
        local_78 = (once_flag *)
                   CONCAT17(cVar36,CONCAT16(cVar34,CONCAT15(cVar32,CONCAT14(cVar30,CONCAT13(cVar28,
                                                  CONCAT12(cVar26,CONCAT11(cVar24,cVar20)))))));
        cStack_70 = cVar38;
        cStack_6f = cVar40;
        cStack_6e = cVar42;
        cStack_6d = cVar44;
        cStack_6c = cVar46;
        cStack_6b = cVar48;
        cStack_6a = cVar50;
        cStack_69 = cVar52;
        uVar6 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar15);
        local_88.field_1.slot_ = (slot_type *)common_00;
        local_88.ctrl_ = (ctrl_t *)&local_90;
        ppDVar13 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   ::slot_array(&common_00->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                               );
        bVar5 = absl::lts_20250127::container_internal::
                hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>::EqualElement<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::internal::DescriptorTable_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>>
                          ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
                            *)&local_88,
                           (EqualElement<const_google::protobuf::internal::DescriptorTable_*> *)
                           (ppDVar13 + (seq.offset_ + uVar6 & seq.mask_)),ts);
        if (bVar5) {
          sVar11 = uVar6 + seq.offset_ & seq.mask_;
          goto LAB_00299041;
        }
        cVar20 = (ctrl_t)local_78;
        cVar24 = local_78._1_1_;
        cVar26 = local_78._2_1_;
        cVar28 = local_78._3_1_;
        cVar30 = local_78._4_1_;
        cVar32 = local_78._5_1_;
        cVar34 = local_78._6_1_;
        cVar36 = local_78._7_1_;
        cVar38 = cStack_70;
        cVar40 = cStack_6f;
        cVar42 = cStack_6e;
        cVar44 = cStack_6d;
        cVar46 = cStack_6c;
        cVar48 = cStack_6b;
        cVar50 = cStack_6a;
        cVar52 = cStack_69;
      }
      auVar22[0] = -(cVar20 == kEmpty);
      auVar22[1] = -(cVar24 == kEmpty);
      auVar22[2] = -(cVar26 == kEmpty);
      auVar22[3] = -(cVar28 == kEmpty);
      auVar22[4] = -(cVar30 == kEmpty);
      auVar22[5] = -(cVar32 == kEmpty);
      auVar22[6] = -(cVar34 == kEmpty);
      auVar22[7] = -(cVar36 == kEmpty);
      auVar22[8] = -(cVar38 == kEmpty);
      auVar22[9] = -(cVar40 == kEmpty);
      auVar22[10] = -(cVar42 == kEmpty);
      auVar22[0xb] = -(cVar44 == kEmpty);
      auVar22[0xc] = -(cVar46 == kEmpty);
      auVar22[0xd] = -(cVar48 == kEmpty);
      auVar22[0xe] = -(cVar50 == kEmpty);
      auVar22[0xf] = -(cVar52 == kEmpty);
      x = (ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf;
      if (x != 0) break;
      uVar16 = seq.index_ + 0x10;
      seq.offset_ = seq.offset_ + uVar16 & seq.mask_;
      seq.index_ = uVar16;
      sVar11 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ::capacity(&common_00->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                         );
      if (sVar11 < uVar16) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = const google::protobuf::internal::DescriptorTable *]"
                     );
      }
    }
    sVar11 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             ::capacity(&common_00->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       );
    pcVar9 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             ::control(&common_00->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                      );
    bVar5 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                      (sVar11,(size_t)common,pcVar9);
    if (bVar5) {
      uVar3 = 0xf;
      if (x != 0) {
        for (; x >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar7 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
    }
    else {
      uVar7 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(x);
    }
    target.probe_length =
         (size_t)absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
                 ::GetPolicyFunctions()::value;
    target.offset = seq.index_;
    sVar11 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                       ((container_internal *)common_00,common,uVar7 + seq.offset_ & seq.mask_,
                        target,in_R9);
LAB_00299041:
    iVar54 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             ::iterator_at(&common_00->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                           ,sVar11);
    if (uVar15 != 0) {
LAB_0029937b:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&seq,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                 ,0x15c);
      this = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)&seq,(char (*) [29])"File is already registered: ");
      absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                (this,&local_90->filename);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&seq);
    }
  }
  sVar11 = (common_00->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  (common_00->
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ).settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9c;
  *iVar54.field_1.slot_ = local_90;
  local_40 = iVar54;
  absl::lts_20250127::container_internal::CommonFields::set_capacity
            ((CommonFields *)common_00,sVar11);
  key = (DescriptorTable *)
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
        ::iterator::operator*(&local_40);
  pDVar14 = key;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
  ::AssertOnFind<google::protobuf::internal::DescriptorTable_const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
              *)common_00,(DescriptorTable **)key);
  bVar5 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          ::is_soo(&common_00->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                  );
  if (bVar5) {
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            ::is_soo(&common_00->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                    );
    if (!bVar5) {
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe21,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = const google::protobuf::internal::DescriptorTable *]"
                   );
    }
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            ::empty(&common_00->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   );
    if (!bVar5) {
      seq.offset_ = (size_t)common_00;
      seq.mask_ = (size_t)key;
      pEVar10 = (EqualElement<const_google::protobuf::internal::DescriptorTable_*> *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                ::soo_slot(&common_00->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                          );
      bVar5 = absl::lts_20250127::container_internal::
              hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>::EqualElement<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::internal::DescriptorTable_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>>
                        ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
                          *)&seq,pEVar10,ts_01);
      if (bVar5) {
        seq._0_16_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                     ::soo_iterator(&common_00->
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                   );
        goto LAB_002992ff;
      }
    }
  }
  else {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
    ::prefetch_heap_block
              (&common_00->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              );
    sVar11 = anon_unknown_19::GeneratedMessageFactory::DescriptorByNameHash::operator()
                       ((DescriptorByNameHash *)*(DescriptorTable **)key,pDVar14);
    bVar5 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            ::is_soo(&common_00->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                    );
    if (bVar5) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = const google::protobuf::internal::DescriptorTable *]"
                   );
    }
    absl::lts_20250127::container_internal::probe(&seq,(CommonFields *)common_00,sVar11);
    poVar12 = (once_flag *)
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              ::control(&common_00->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       );
    auVar18 = ZEXT216(CONCAT11((char)sVar11,(char)sVar11) & 0x7f7f);
    auVar18 = pshuflw(auVar18,auVar18,0);
    uVar17 = auVar18._0_4_;
    local_68._4_4_ = uVar17;
    local_68._0_4_ = uVar17;
    local_68._8_4_ = uVar17;
    local_68._12_4_ = uVar17;
    while( true ) {
      pbVar2 = (byte *)((long)&(poVar12->control_).super___atomic_base<unsigned_int>._M_i +
                       seq.offset_);
      auVar19[0] = -(local_68[0] == *pbVar2);
      auVar19[1] = -(local_68[1] == pbVar2[1]);
      auVar19[2] = -(local_68[2] == pbVar2[2]);
      auVar19[3] = -(local_68[3] == pbVar2[3]);
      auVar19[4] = -(local_68[4] == pbVar2[4]);
      auVar19[5] = -(local_68[5] == pbVar2[5]);
      auVar19[6] = -(local_68[6] == pbVar2[6]);
      auVar19[7] = -(local_68[7] == pbVar2[7]);
      auVar19[8] = -(local_68[8] == pbVar2[8]);
      auVar19[9] = -(local_68[9] == pbVar2[9]);
      auVar19[10] = -(local_68[10] == pbVar2[10]);
      auVar19[0xb] = -(local_68[0xb] == pbVar2[0xb]);
      auVar19[0xc] = -(local_68[0xc] == pbVar2[0xc]);
      auVar19[0xd] = -(local_68[0xd] == pbVar2[0xd]);
      auVar19[0xe] = -(local_68[0xe] == pbVar2[0xe]);
      auVar19[0xf] = -(local_68[0xf] == pbVar2[0xf]);
      bVar21 = *pbVar2;
      bVar25 = pbVar2[1];
      bVar27 = pbVar2[2];
      bVar29 = pbVar2[3];
      bVar31 = pbVar2[4];
      bVar33 = pbVar2[5];
      bVar35 = pbVar2[6];
      bVar37 = pbVar2[7];
      bVar39 = pbVar2[8];
      bVar41 = pbVar2[9];
      bVar43 = pbVar2[10];
      bVar45 = pbVar2[0xb];
      bVar47 = pbVar2[0xc];
      bVar49 = pbVar2[0xd];
      bVar51 = pbVar2[0xe];
      bVar53 = pbVar2[0xf];
      for (uVar15 = (ushort)(SUB161(auVar19 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar19[0xf] >> 7) << 0xf; uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
        local_78 = poVar12;
        local_58 = bVar21;
        bStack_57 = bVar25;
        bStack_56 = bVar27;
        bStack_55 = bVar29;
        bStack_54 = bVar31;
        bStack_53 = bVar33;
        bStack_52 = bVar35;
        bStack_51 = bVar37;
        bStack_50 = bVar39;
        bStack_4f = bVar41;
        bStack_4e = bVar43;
        bStack_4d = bVar45;
        bStack_4c = bVar47;
        bStack_4b = bVar49;
        bStack_4a = bVar51;
        bStack_49 = bVar53;
        uVar6 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar15);
        local_88.field_1.slot_ = (slot_type *)common_00;
        local_88.ctrl_ = (ctrl_t *)key;
        ppDVar13 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   ::slot_array(&common_00->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                               );
        bVar5 = absl::lts_20250127::container_internal::
                hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>::EqualElement<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::internal::DescriptorTable_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>>
                          ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
                            *)&local_88,
                           (EqualElement<const_google::protobuf::internal::DescriptorTable_*> *)
                           (ppDVar13 + (seq.offset_ + uVar6 & seq.mask_)),ts_02);
        if (bVar5) {
          seq._0_16_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       ::iterator_at(&common_00->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                     ,uVar6 + seq.offset_ & seq.mask_);
          goto LAB_002992ff;
        }
        poVar12 = local_78;
        bVar21 = local_58;
        bVar25 = bStack_57;
        bVar27 = bStack_56;
        bVar29 = bStack_55;
        bVar31 = bStack_54;
        bVar33 = bStack_53;
        bVar35 = bStack_52;
        bVar37 = bStack_51;
        bVar39 = bStack_50;
        bVar41 = bStack_4f;
        bVar43 = bStack_4e;
        bVar45 = bStack_4d;
        bVar47 = bStack_4c;
        bVar49 = bStack_4b;
        bVar51 = bStack_4a;
        bVar53 = bStack_49;
      }
      auVar23[0] = -(bVar21 == 0x80);
      auVar23[1] = -(bVar25 == 0x80);
      auVar23[2] = -(bVar27 == 0x80);
      auVar23[3] = -(bVar29 == 0x80);
      auVar23[4] = -(bVar31 == 0x80);
      auVar23[5] = -(bVar33 == 0x80);
      auVar23[6] = -(bVar35 == 0x80);
      auVar23[7] = -(bVar37 == 0x80);
      auVar23[8] = -(bVar39 == 0x80);
      auVar23[9] = -(bVar41 == 0x80);
      auVar23[10] = -(bVar43 == 0x80);
      auVar23[0xb] = -(bVar45 == 0x80);
      auVar23[0xc] = -(bVar47 == 0x80);
      auVar23[0xd] = -(bVar49 == 0x80);
      auVar23[0xe] = -(bVar51 == 0x80);
      auVar23[0xf] = -(bVar53 == 0x80);
      if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar23 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar23 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar23 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar23 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar53 == 0x80)
      break;
      uVar16 = seq.index_ + 0x10;
      seq.offset_ = seq.offset_ + uVar16 & seq.mask_;
      seq.index_ = uVar16;
      sVar11 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ::capacity(&common_00->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                         );
      if (sVar11 < uVar16) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = const google::protobuf::internal::DescriptorTable *]"
                     );
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            (&common_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            );
  auVar4._8_8_ = 0;
  auVar4._0_8_ = extraout_RDX;
  seq._0_16_ = auVar4 << 0x40;
LAB_002992ff:
  local_88 = iVar54;
  bVar5 = absl::lts_20250127::container_internal::operator==((iterator *)&seq,&local_88);
  if (!bVar5) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xfe2,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, Args = <const google::protobuf::internal::DescriptorTable *const &>]"
                 );
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const google::protobuf::internal::DescriptorTable* table) {
  GeneratedMessageFactory::singleton()->RegisterFile(table);
}